

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elempatch.c
# Opt level: O0

void nga_vfill_patch(Integer *g_a,Integer *lo,Integer *hi)

{
  int iVar1;
  int iVar2;
  logical lVar3;
  Integer *in_RDX;
  Integer *in_RSI;
  Integer *in_RDI;
  Integer *unaff_retaddr;
  Integer *in_stack_00000008;
  int local_sync_end;
  int local_sync_begin;
  Integer me;
  Integer baseld [7];
  Integer bunit [7];
  Integer bvalue [7];
  Integer n1dim;
  Integer idx;
  void *data_ptr;
  Integer ld [7];
  Integer hiA [7];
  Integer loA [7];
  Integer type;
  Integer dims [7];
  Integer ndim;
  Integer j;
  Integer i;
  int in_stack_fffffffffffffdec;
  long local_1f8 [8];
  long local_1b8 [8];
  long local_178 [7];
  long local_140;
  long local_138;
  long local_130;
  long local_128 [8];
  long local_e8 [8];
  long local_a8 [7];
  long local_70;
  Integer local_30;
  long local_28;
  long local_20;
  Integer *local_18;
  Integer *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  pnga_nodeid();
  iVar2 = _ga_sync_end;
  iVar1 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar1 != 0) {
    GA_Sync();
  }
  pnga_inquire(_local_sync_end,in_stack_00000008,unaff_retaddr,in_RDI);
  pnga_distribution(ld[4],ld[3],(Integer *)ld[2],(Integer *)ld[1]);
  lVar3 = pnga_patch_intersect(local_10,local_18,local_a8,local_e8,local_30);
  if (lVar3 != 0) {
    pnga_access_ptr(j,(Integer *)ndim,(Integer *)dims[6],(void *)dims[5],(Integer *)dims[4]);
    local_140 = 1;
    for (local_20 = 1; local_20 < local_30; local_20 = local_20 + 1) {
      local_140 = ((local_e8[local_20] - local_a8[local_20]) + 1) * local_140;
    }
    local_178[0] = 0;
    local_178[1] = 0;
    local_1b8[0] = 1;
    local_1b8[1] = 1;
    local_1f8[0] = local_128[0];
    local_1f8[1] = local_128[0] * local_128[1];
    for (local_20 = 2; local_20 < local_30; local_20 = local_20 + 1) {
      local_178[local_20] = 0;
      local_1b8[local_20] =
           local_1b8[local_20 + -1] * ((local_e8[local_20 + -1] - local_a8[local_20 + -1]) + 1);
      local_1f8[local_20] = local_1f8[local_20 + -1] * local_128[local_20];
    }
    switch((char *)(local_70 + -0x3e9)) {
    case (char *)0x0:
      for (local_20 = 0; local_20 < local_140; local_20 = local_20 + 1) {
        local_138 = 0;
        for (local_28 = 1; local_28 < local_30; local_28 = local_28 + 1) {
          local_138 = local_178[local_28] * local_1f8[local_28 + -1] + local_138;
          if ((local_20 + 1) % local_1b8[local_28] == 0) {
            local_178[local_28] = local_178[local_28] + 1;
          }
          if (local_e8[local_28] - local_a8[local_28] < local_178[local_28]) {
            local_178[local_28] = 0;
          }
        }
        for (local_28 = 0; local_28 < (local_e8[0] - local_a8[0]) + 1; local_28 = local_28 + 1) {
          *(int *)(local_130 + (local_138 + local_28) * 4) = (int)local_138 + (int)local_28;
        }
      }
      break;
    case (char *)0x1:
      for (local_20 = 0; local_20 < local_140; local_20 = local_20 + 1) {
        local_138 = 0;
        for (local_28 = 1; local_28 < local_30; local_28 = local_28 + 1) {
          local_138 = local_178[local_28] * local_1f8[local_28 + -1] + local_138;
          if ((local_20 + 1) % local_1b8[local_28] == 0) {
            local_178[local_28] = local_178[local_28] + 1;
          }
          if (local_e8[local_28] - local_a8[local_28] < local_178[local_28]) {
            local_178[local_28] = 0;
          }
        }
        for (local_28 = 0; local_28 < (local_e8[0] - local_a8[0]) + 1; local_28 = local_28 + 1) {
          *(long *)(local_130 + (local_138 + local_28) * 8) = local_138 + local_28;
        }
      }
      break;
    case (char *)0x2:
      for (local_20 = 0; local_20 < local_140; local_20 = local_20 + 1) {
        local_138 = 0;
        for (local_28 = 1; local_28 < local_30; local_28 = local_28 + 1) {
          local_138 = local_178[local_28] * local_1f8[local_28 + -1] + local_138;
          if ((local_20 + 1) % local_1b8[local_28] == 0) {
            local_178[local_28] = local_178[local_28] + 1;
          }
          if (local_e8[local_28] - local_a8[local_28] < local_178[local_28]) {
            local_178[local_28] = 0;
          }
        }
        for (local_28 = 0; local_28 < (local_e8[0] - local_a8[0]) + 1; local_28 = local_28 + 1) {
          *(float *)(local_130 + (local_138 + local_28) * 4) = (float)(local_138 + local_28);
        }
      }
      break;
    case (char *)0x3:
      for (local_20 = 0; local_20 < local_140; local_20 = local_20 + 1) {
        local_138 = 0;
        for (local_28 = 1; local_28 < local_30; local_28 = local_28 + 1) {
          local_138 = local_178[local_28] * local_1f8[local_28 + -1] + local_138;
          if ((local_20 + 1) % local_1b8[local_28] == 0) {
            local_178[local_28] = local_178[local_28] + 1;
          }
          if (local_e8[local_28] - local_a8[local_28] < local_178[local_28]) {
            local_178[local_28] = 0;
          }
        }
        for (local_28 = 0; local_28 < (local_e8[0] - local_a8[0]) + 1; local_28 = local_28 + 1) {
          *(double *)(local_130 + (local_138 + local_28) * 8) = (double)(local_138 + local_28);
        }
      }
      break;
    default:
      GA_Error((char *)(local_70 + -0x3e9),in_stack_fffffffffffffdec);
      break;
    case (char *)0x5:
      for (local_20 = 0; local_20 < local_140; local_20 = local_20 + 1) {
        local_138 = 0;
        for (local_28 = 1; local_28 < local_30; local_28 = local_28 + 1) {
          local_138 = local_178[local_28] * local_1f8[local_28 + -1] + local_138;
          if ((local_20 + 1) % local_1b8[local_28] == 0) {
            local_178[local_28] = local_178[local_28] + 1;
          }
          if (local_e8[local_28] - local_a8[local_28] < local_178[local_28]) {
            local_178[local_28] = 0;
          }
        }
        for (local_28 = 0; local_28 < (local_e8[0] - local_a8[0]) + 1; local_28 = local_28 + 1) {
          *(float *)(local_130 + (local_138 + local_28) * 8) = (float)(local_138 + local_28);
          *(float *)(local_130 + 4 + (local_138 + local_28) * 8) = (float)(local_138 + local_28);
        }
      }
      break;
    case (char *)0x6:
      for (local_20 = 0; local_20 < local_140; local_20 = local_20 + 1) {
        local_138 = 0;
        for (local_28 = 1; local_28 < local_30; local_28 = local_28 + 1) {
          local_138 = local_178[local_28] * local_1f8[local_28 + -1] + local_138;
          if ((local_20 + 1) % local_1b8[local_28] == 0) {
            local_178[local_28] = local_178[local_28] + 1;
          }
          if (local_e8[local_28] - local_a8[local_28] < local_178[local_28]) {
            local_178[local_28] = 0;
          }
        }
        for (local_28 = 0; local_28 < (local_e8[0] - local_a8[0]) + 1; local_28 = local_28 + 1) {
          *(double *)(local_130 + (local_138 + local_28) * 0x10) = (double)(local_138 + local_28);
          *(double *)(local_130 + (local_138 + local_28) * 0x10 + 8) =
               (double)(local_138 + local_28);
        }
      }
    }
    pnga_release_update(*in_RDI,local_a8,local_e8);
  }
  if (iVar2 != 0) {
    GA_Sync();
  }
  return;
}

Assistant:

void nga_vfill_patch(Integer *g_a, Integer *lo, Integer *hi)
{
  Integer i, j;
  Integer ndim, dims[MAXDIM], type;
  Integer loA[MAXDIM], hiA[MAXDIM], ld[MAXDIM];
  void *data_ptr;
  Integer idx, n1dim;
  Integer bvalue[MAXDIM], bunit[MAXDIM], baseld[MAXDIM];
  Integer me= pnga_nodeid();
  int local_sync_begin,local_sync_end;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)GA_Sync(); 

  pnga_inquire(*g_a,  &type, &ndim, dims);

  /* get limits of VISIBLE patch */ 
  pnga_distribution(*g_a, me, loA, hiA);

  /*  determine subset of my local patch to access  */
  /*  Output is in loA and hiA */
  if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

    /* get data_ptr to corner of patch */
    /* ld are leading dimensions INCLUDING ghost cells */
    pnga_access_ptr(*g_a, loA, hiA, &data_ptr, ld);

    /* number of n-element of the first dimension */
    n1dim = 1; for(i=1; i<ndim; i++) n1dim *= (hiA[i] - loA[i] + 1);

    /* calculate the destination indices */
    bvalue[0] = 0; bvalue[1] = 0; bunit[0] = 1; bunit[1] = 1;
    /* baseld[0] = ld[0]
     * baseld[1] = ld[0] * ld[1]
     * baseld[2] = ld[0] * ld[1] * ld[2] .....
     */
    baseld[0] = ld[0]; baseld[1] = baseld[0] *ld[1];
    for(i=2; i<ndim; i++) {
      bvalue[i] = 0;
      bunit[i] = bunit[i-1] * (hiA[i-1] - loA[i-1] + 1);
      baseld[i] = baseld[i-1] * ld[i];
    }

    switch (type){
      case C_INT:
        for(i=0; i<n1dim; i++) {
          idx = 0;
          for(j=1; j<ndim; j++) {
            idx += bvalue[j] * baseld[j-1];
            if(((i+1) % bunit[j]) == 0) bvalue[j]++;
            if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
          }
          for(j=0; j<(hiA[0]-loA[0]+1); j++)
            ((int *)data_ptr)[idx+j] = (int)(idx+j);
        }
        break;
      case C_DCPL:
        for(i=0; i<n1dim; i++) {
          idx = 0;
          for(j=1; j<ndim; j++) {
            idx += bvalue[j] * baseld[j-1];
            if(((i+1) % bunit[j]) == 0) bvalue[j]++;
            if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
          }

          for(j=0; j<(hiA[0]-loA[0]+1); j++) {
            ((DoubleComplex *)data_ptr)[idx+j].real = (double)(idx+j);
            ((DoubleComplex *)data_ptr)[idx+j].imag = (double)(idx+j);
          }
        }

        break;
      case C_SCPL:
        for(i=0; i<n1dim; i++) {
          idx = 0;
          for(j=1; j<ndim; j++) {
            idx += bvalue[j] * baseld[j-1];
            if(((i+1) % bunit[j]) == 0) bvalue[j]++;
            if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
          }

          for(j=0; j<(hiA[0]-loA[0]+1); j++) {
            ((SingleComplex *)data_ptr)[idx+j].real = (float)(idx+j);
            ((SingleComplex *)data_ptr)[idx+j].imag = (float)(idx+j);
          }
        }

        break;
      case C_DBL:
        for(i=0; i<n1dim; i++) {
          idx = 0;
          for(j=1; j<ndim; j++) {
            idx += bvalue[j] * baseld[j-1];
            if(((i+1) % bunit[j]) == 0) bvalue[j]++;
            if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
          }

          for(j=0; j<(hiA[0]-loA[0]+1); j++) 
            ((double*)data_ptr)[idx+j] = (double)(idx+j);
        }
        break;
      case C_FLOAT:
        for(i=0; i<n1dim; i++) {
          idx = 0;
          for(j=1; j<ndim; j++) {
            idx += bvalue[j] * baseld[j-1];
            if(((i+1) % bunit[j]) == 0) bvalue[j]++;
            if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
          }
          for(j=0; j<(hiA[0]-loA[0]+1); j++)
            ((float *)data_ptr)[idx+j] = (float)(idx+j);
        }
        break;     
      case C_LONG:
        for(i=0; i<n1dim; i++) {
          idx = 0;
          for(j=1; j<ndim; j++) {
            idx += bvalue[j] * baseld[j-1];
            if(((i+1) % bunit[j]) == 0) bvalue[j]++;
            if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
          }
          for(j=0; j<(hiA[0]-loA[0]+1); j++)
            ((long *)data_ptr)[idx+j] = (long)(idx+j);
        } 
        break;                          
      default: GA_Error(" wrong data type ",type);
    }

    /* release access to the data */
    pnga_release_update(*g_a, loA, hiA);
  }
  if(local_sync_end)GA_Sync();
}